

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::addMoleculeStamp(SimInfo *this,MoleculeStamp *molStamp,int nmol)

{
  iterator __position;
  pointer ppMVar1;
  int iVar2;
  int curStampId;
  int local_24;
  MoleculeStamp *local_20;
  
  __position._M_current =
       (this->moleculeStamps_).
       super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  iVar2 = (int)((ulong)((long)__position._M_current -
                       (long)(this->moleculeStamps_).
                             super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_24 = iVar2;
  local_20 = molStamp;
  if (__position._M_current ==
      (this->moleculeStamps_).
      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMD::MoleculeStamp*,std::allocator<OpenMD::MoleculeStamp*>>::
    _M_realloc_insert<OpenMD::MoleculeStamp*const&>
              ((vector<OpenMD::MoleculeStamp*,std::allocator<OpenMD::MoleculeStamp*>> *)
               &this->moleculeStamps_,__position,&local_20);
    ppMVar1 = (this->moleculeStamps_).
              super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = molStamp;
    ppMVar1 = (this->moleculeStamps_).
              super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->moleculeStamps_).
    super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar1;
  }
  ppMVar1[-1]->ident_ = iVar2;
  std::vector<int,_std::allocator<int>_>::_M_fill_insert
            (&this->molStampIds_,
             (iterator)
             (this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,(long)nmol,&local_24);
  return;
}

Assistant:

void SimInfo::addMoleculeStamp(MoleculeStamp* molStamp, int nmol) {
    int curStampId;

    // index from 0
    curStampId = moleculeStamps_.size();

    moleculeStamps_.push_back(molStamp);
    moleculeStamps_[moleculeStamps_.size() - 1]->setIdent(curStampId);
    molStampIds_.insert(molStampIds_.end(), nmol, curStampId);
  }